

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextVoid(char *str_id,int mouse_button)

{
  bool bVar1;
  ImGuiID id_00;
  ImGuiID id;
  int mouse_button_local;
  char *str_id_local;
  
  _id = str_id;
  if (str_id == (char *)0x0) {
    _id = "void_context";
  }
  id_00 = ImGuiWindow::GetID(GImGui->CurrentWindow,_id,(char *)0x0);
  bVar1 = IsMouseReleased(mouse_button);
  if ((bVar1) && (bVar1 = IsWindowHovered(4), !bVar1)) {
    OpenPopupEx(id_00);
  }
  bVar1 = BeginPopupEx(id_00,0x141);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextVoid(const char* str_id, int mouse_button)
{
    if (!str_id)
        str_id = "void_context";
    ImGuiID id = GImGui->CurrentWindow->GetID(str_id);
    if (IsMouseReleased(mouse_button) && !IsWindowHovered(ImGuiHoveredFlags_AnyWindow))
        OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}